

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lratchecker.cpp
# Opt level: O3

void __thiscall CaDiCaL::LratChecker::insert(LratChecker *this)

{
  int64_t *piVar1;
  LratCheckerClause **ppLVar2;
  uint uVar3;
  LratCheckerClause *pLVar4;
  sbyte sVar5;
  ulong uVar6;
  uint64_t uVar7;
  
  piVar1 = &(this->stats).insertions;
  *piVar1 = *piVar1 + 1;
  uVar7 = this->size_clauses;
  if (this->num_clauses == uVar7) {
    enlarge_clauses(this);
    uVar7 = this->size_clauses;
  }
  uVar6 = this->last_id * this->nonces[(uint)this->last_id & 3];
  this->last_hash = uVar6;
  if (uVar7 >> 0x20 == 0) {
    uVar3 = 0x20;
    do {
      sVar5 = (sbyte)uVar3;
      uVar3 = uVar3 >> 1;
      uVar6 = uVar6 ^ uVar6 >> sVar5;
    } while (uVar7 >> (sbyte)uVar3 == 0);
  }
  uVar6 = uVar7 - 1 & uVar6;
  pLVar4 = new_clause(this);
  ppLVar2 = this->clauses;
  pLVar4->next = ppLVar2[uVar6];
  ppLVar2[uVar6] = pLVar4;
  return;
}

Assistant:

void LratChecker::insert () {
  stats.insertions++;
  if (num_clauses == size_clauses)
    enlarge_clauses ();
  const uint64_t h = reduce_hash (compute_hash (last_id), size_clauses);
  LratCheckerClause *c = new_clause ();
  c->next = clauses[h];
  clauses[h] = c;
}